

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void compile_finish(c2m_ctx_t c2m_ctx)

{
  char cVar1;
  MIR_context_t pMVar2;
  undefined8 *puVar3;
  pre_ctx *ppVar4;
  FILE *pFVar5;
  long lVar6;
  long lVar7;
  VARR_char *pVVar8;
  char *pcVar9;
  VARR_pos_t *pVVar10;
  pos_t *ppVar11;
  parse_ctx *ppVar12;
  VARR_stream_t *pVVar13;
  stream_t *ppsVar14;
  VARR_token_t *pVVar15;
  pre_ctx *ppVar16;
  tm *__tp;
  size_t sVar17;
  VARR_char_ptr_t *pVVar18;
  char_ptr_t *ppcVar19;
  VARR_macro_t *pVVar20;
  macro_t *ppmVar21;
  HTAB_macro_t *pHVar22;
  VARR_HTAB_EL_macro_t *pVVar23;
  HTAB_EL_macro_t *pHVar24;
  VARR_htab_ind_t *pVVar25;
  htab_ind_t *phVar26;
  ulong uVar27;
  token_t ptVar28;
  VARR_ifstate_t *pVVar29;
  ifstate_t *ppiVar30;
  VARR_macro_call_t *pVVar31;
  macro_call_t *ppmVar32;
  HTAB_tpname_t *pHVar33;
  VARR_HTAB_EL_tpname_t *pVVar34;
  HTAB_EL_tpname_t *pHVar35;
  check_ctx *pcVar36;
  c2m_ctx_t pcVar37;
  VARR_node_t *pVVar38;
  node_t_conflict *ppnVar39;
  HTAB_symbol_t *pHVar40;
  VARR_HTAB_EL_symbol_t *pVVar41;
  HTAB_EL_symbol_t *pHVar42;
  HTAB_case_t *pHVar43;
  VARR_HTAB_EL_case_t *pVVar44;
  HTAB_EL_case_t *pHVar45;
  VARR_decl_t *pVVar46;
  decl_t *ppdVar47;
  ulong uVar48;
  c2mir_options *pcVar49;
  token_t ptVar50;
  VARR_init_object_t *pVVar51;
  init_object_t *piVar52;
  stream_t psVar53;
  void *pvVar54;
  MIR_context_t in_RCX;
  _func_int_void_ptr *extraout_RDX;
  char *fname;
  size_t sVar55;
  int iVar56;
  macro_t *unaff_RBP;
  MIR_context_t in_RSI;
  c2m_ctx_t pcVar57;
  token_t *pptVar58;
  c2m_ctx_t pcVar59;
  pre_ctx *unaff_R12;
  pre_ctx *unaff_R13;
  char *pcVar60;
  check_ctx *unaff_R15;
  pos_t pos;
  pos_t pos_00;
  pos_t pos_01;
  tm tStack_f8;
  macro_t pmStack_c0;
  c2m_ctx_t pcStack_b8;
  pre_ctx *ppStack_b0;
  ulong uStack_a8;
  time_t tStack_a0;
  c2m_ctx_t pcStack_98;
  pre_ctx *ppStack_90;
  pre_ctx *ppStack_88;
  c2m_ctx_t pcStack_80;
  check_ctx *pcStack_78;
  macro_t *ppmStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  MIR_context_t local_38;
  
  pcVar37 = (c2m_ctx_t)c2m_ctx->symbol_text;
  pcVar59 = c2m_ctx;
  if (pcVar37 != (c2m_ctx_t)0x0) {
    pcVar57 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0];
    if (pcVar57 != (c2m_ctx_t)0x0) {
      ppmStack_70 = (macro_t *)0x177f41;
      free(pcVar57);
      ppmStack_70 = (macro_t *)0x177f49;
      free(pcVar37);
      c2m_ctx->symbol_text = (VARR_char *)0x0;
      pcVar59 = pcVar37;
      goto LAB_00177f54;
    }
LAB_001788c4:
    ppmStack_70 = (macro_t *)0x1788c9;
    compile_finish_cold_1();
LAB_001788c9:
    ppmStack_70 = (macro_t *)0x1788ce;
    compile_finish_cold_2();
LAB_001788ce:
    ppmStack_70 = (macro_t *)0x1788d3;
    compile_finish_cold_3();
LAB_001788d3:
    ppmStack_70 = (macro_t *)0x1788d8;
    compile_finish_cold_40();
LAB_001788d8:
    ppmStack_70 = (macro_t *)0x1788dd;
    compile_finish_cold_41();
LAB_001788dd:
    ppmStack_70 = (macro_t *)0x1788e2;
    compile_finish_cold_42();
LAB_001788e2:
    ppmStack_70 = (macro_t *)0x1788e7;
    compile_finish_cold_43();
LAB_001788e7:
    ppmStack_70 = (macro_t *)0x1788ec;
    compile_finish_cold_44();
    pcVar59 = pcVar57;
LAB_001788ec:
    pcVar57 = pcVar59;
    ppmStack_70 = (macro_t *)0x1788f1;
    compile_finish_cold_17();
LAB_001788f1:
    ppmStack_70 = (macro_t *)0x1788f6;
    compile_finish_cold_16();
    pcVar59 = pcVar57;
    pcVar57 = pcVar37;
LAB_001788f6:
    ppmStack_70 = (macro_t *)0x1788fb;
    compile_finish_cold_4();
LAB_001788fb:
    ppmStack_70 = (macro_t *)0x178900;
    compile_finish_cold_5();
LAB_00178900:
    ppmStack_70 = (macro_t *)0x178905;
    compile_finish_cold_30();
LAB_00178905:
    ppmStack_70 = (macro_t *)0x17890a;
    compile_finish_cold_31();
LAB_0017890a:
    ppmStack_70 = (macro_t *)0x17890f;
    compile_finish_cold_38();
LAB_0017890f:
    ppmStack_70 = (macro_t *)0x178914;
    compile_finish_cold_39();
    goto LAB_00178914;
  }
LAB_00177f54:
  pcVar37 = (c2m_ctx_t)c2m_ctx->temp_string;
  if (pcVar37 != (c2m_ctx_t)0x0) {
    pcVar57 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0];
    if (pcVar57 != (c2m_ctx_t)0x0) {
      ppmStack_70 = (macro_t *)0x177f72;
      free(pcVar57);
      ppmStack_70 = (macro_t *)0x177f7a;
      free(pcVar37);
      c2m_ctx->temp_string = (VARR_char *)0x0;
      pcVar59 = pcVar37;
      goto LAB_00177f85;
    }
    goto LAB_001788c9;
  }
LAB_00177f85:
  pcVar37 = (c2m_ctx_t)c2m_ctx->node_positions;
  if (pcVar37 != (c2m_ctx_t)0x0) {
    pcVar57 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0];
    if (pcVar57 != (c2m_ctx_t)0x0) {
      ppmStack_70 = (macro_t *)0x177fa3;
      free(pcVar57);
      ppmStack_70 = (macro_t *)0x177fab;
      free(pcVar37);
      c2m_ctx->node_positions = (VARR_pos_t *)0x0;
      pcVar59 = pcVar37;
      goto LAB_00177fb6;
    }
    goto LAB_001788ce;
  }
LAB_00177fb6:
  if (c2m_ctx->parse_ctx == (parse_ctx *)0x0) goto LAB_001784fb;
  pcVar57 = (c2m_ctx_t)c2m_ctx->recorded_tokens;
  if (pcVar57 != (c2m_ctx_t)0x0) {
    pcVar59 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0];
    if (pcVar59 != (c2m_ctx_t)0x0) {
      ppmStack_70 = (macro_t *)0x177fe2;
      free(pcVar59);
      ppmStack_70 = (macro_t *)0x177fea;
      free(pcVar57);
      c2m_ctx->recorded_tokens = (VARR_token_t *)0x0;
      pcVar59 = pcVar57;
      goto LAB_00177ff5;
    }
    goto LAB_001788f6;
  }
LAB_00177ff5:
  pcVar57 = (c2m_ctx_t)c2m_ctx->buffered_tokens;
  if (pcVar57 != (c2m_ctx_t)0x0) {
    pcVar59 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0];
    if (pcVar59 != (c2m_ctx_t)0x0) {
      ppmStack_70 = (macro_t *)0x178013;
      free(pcVar59);
      ppmStack_70 = (macro_t *)0x17801b;
      pcVar59 = pcVar57;
      free(pcVar57);
      c2m_ctx->buffered_tokens = (VARR_token_t *)0x0;
      goto LAB_00178026;
    }
    goto LAB_001788fb;
  }
LAB_00178026:
  unaff_R12 = c2m_ctx->pre_ctx;
  if (unaff_R12 == (pre_ctx *)0x0) {
LAB_00178351:
    unaff_R15 = (check_ctx *)c2m_ctx->parse_ctx;
    unaff_R12 = (pre_ctx *)unaff_R15->curr_unnamed_anon_struct_union_member;
    if (unaff_R12 == (pre_ctx *)0x0) {
LAB_0017847a:
      if (c2m_ctx->eof_s != (stream_t)0x0) {
        ppmStack_70 = (macro_t *)0x17848b;
        free_stream(c2m_ctx->eof_s);
      }
      pcVar57 = (c2m_ctx_t)c2m_ctx->streams;
      if (pcVar57 != (c2m_ctx_t)0x0) {
LAB_00178497:
        pMVar2 = pcVar57->ctx;
        pcVar59 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0];
        if (pMVar2 != (MIR_context_t)0x0) {
          if (pcVar59 != (c2m_ctx_t)0x0) goto code_r0x001784ac;
          ppmStack_70 = (macro_t *)0x178892;
          compile_finish_cold_28();
          pcVar37 = pcVar57;
LAB_00178892:
          pcVar57 = pcVar37;
          ppmStack_70 = (macro_t *)0x178897;
          compile_finish_cold_12();
LAB_00178897:
          ppmStack_70 = (macro_t *)0x17889c;
          compile_finish_cold_21();
LAB_0017889c:
          ppmStack_70 = (macro_t *)0x1788a1;
          compile_finish_cold_10();
LAB_001788a1:
          ppmStack_70 = (macro_t *)0x1788a6;
          compile_finish_cold_9();
          goto LAB_001788a6;
        }
        goto LAB_001784ce;
      }
      goto LAB_001784ef;
    }
    lVar6._0_4_ = unaff_R12->no_out_p;
    lVar6._4_4_ = unaff_R12->skip_if_part_p;
    if (lVar6 == 0) {
LAB_00178404:
      unaff_R12 = (pre_ctx *)unaff_R15->curr_unnamed_anon_struct_union_member;
      pcVar57 = (c2m_ctx_t)unaff_R12->if_id;
      pcVar37 = pcVar57;
      if ((pcVar57 == (c2m_ctx_t)0x0) ||
         (pcVar59 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0], pcVar59 == (c2m_ctx_t)0x0))
      goto LAB_001788b5;
      ppmStack_70 = (macro_t *)0x178428;
      free(pcVar59);
      ppmStack_70 = (macro_t *)0x178430;
      free(pcVar57);
      unaff_R12->if_id = (token_t)0x0;
      unaff_R12 = (pre_ctx *)unaff_R15->curr_unnamed_anon_struct_union_member;
      pcVar37 = *(c2m_ctx_t *)unaff_R12->date_str;
      if ((pcVar37 != (c2m_ctx_t)0x0) &&
         (pcVar57 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0], pcVar57 != (c2m_ctx_t)0x0)) {
        ppmStack_70 = (macro_t *)0x17845d;
        free(pcVar57);
        ppmStack_70 = (macro_t *)0x178465;
        free(pcVar37);
        unaff_R12->date_str[0] = '\0';
        unaff_R12->date_str[1] = '\0';
        unaff_R12->date_str[2] = '\0';
        unaff_R12->date_str[3] = '\0';
        unaff_R12->date_str[4] = '\0';
        unaff_R12->date_str[5] = '\0';
        unaff_R12->date_str[6] = '\0';
        unaff_R12->date_str[7] = '\0';
        ppmStack_70 = (macro_t *)0x178476;
        free(unaff_R15->curr_unnamed_anon_struct_union_member);
        unaff_R15->curr_unnamed_anon_struct_union_member = (node_t_conflict)0x0;
        goto LAB_0017847a;
      }
      goto LAB_001788bf;
    }
    if (unaff_R12->if_id == (token_t)0x0) goto LAB_00178932;
    if (*(int *)&unaff_R12->temp_tokens != 0) {
      pcVar57 = (c2m_ctx_t)unaff_R12->macro_tab;
      unaff_R13 = (pre_ctx *)(*(long *)&(unaff_R12->if_id->pos).lno + 8);
      unaff_RBP = (macro_t *)0x0;
      do {
        if (*(int *)((long)unaff_R13 + -8) != 0) {
          uStack_58 = *(undefined8 *)((long)unaff_R13 + 0x10);
          local_68 = unaff_R13->once_include_files;
          uStack_60 = *(undefined8 *)((long)unaff_R13 + 8);
          ppmStack_70 = (macro_t *)0x1783b9;
          pcVar59 = pcVar57;
          (**(code **)&unaff_R12->no_out_p)();
        }
        unaff_RBP = (macro_t *)((long)unaff_RBP + 1);
        unaff_R13 = (pre_ctx *)((long)unaff_R13 + 0x20);
      } while (unaff_RBP < (undefined8 *)(ulong)*(uint *)&unaff_R12->temp_tokens);
    }
    *(undefined4 *)&unaff_R12->temp_tokens = 0;
    unaff_R12->once_include_files = (VARR_char_ptr_t *)0x0;
    puVar3 = *(undefined8 **)unaff_R12->date_str;
    if (puVar3 != (undefined8 *)0x0) {
      in_RCX = (MIR_context_t)*puVar3;
      if ((int)in_RCX != 0) {
        pcVar59 = (c2m_ctx_t)puVar3[2];
        in_RSI = (MIR_context_t)0xff;
        ppmStack_70 = (macro_t *)0x178404;
        memset(pcVar59,0xff,((ulong)in_RCX & 0xffffffff) << 2);
      }
      goto LAB_00178404;
    }
    goto LAB_00178937;
  }
  pcVar57 = (c2m_ctx_t)unaff_R12->once_include_files;
  if (pcVar57 != (c2m_ctx_t)0x0) {
    pcVar59 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0];
    if (pcVar59 != (c2m_ctx_t)0x0) {
      ppmStack_70 = (macro_t *)0x178051;
      free(pcVar59);
      ppmStack_70 = (macro_t *)0x178059;
      free(pcVar57);
      unaff_R12->once_include_files = (VARR_char_ptr_t *)0x0;
      pcVar59 = pcVar57;
      goto LAB_00178061;
    }
    goto LAB_00178919;
  }
LAB_00178061:
  pcVar57 = (c2m_ctx_t)unaff_R12->temp_tokens;
  if (pcVar57 != (c2m_ctx_t)0x0) {
    pcVar59 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0];
    if (pcVar59 != (c2m_ctx_t)0x0) {
      ppmStack_70 = (macro_t *)0x17807d;
      free(pcVar59);
      ppmStack_70 = (macro_t *)0x178085;
      free(pcVar57);
      unaff_R12->temp_tokens = (VARR_token_t *)0x0;
      pcVar59 = pcVar57;
      goto LAB_0017808e;
    }
    goto LAB_0017891e;
  }
LAB_0017808e:
  pcVar57 = (c2m_ctx_t)unaff_R12->output_buffer;
  if (pcVar57 != (c2m_ctx_t)0x0) {
    pcVar59 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0];
    if (pcVar59 != (c2m_ctx_t)0x0) {
      ppmStack_70 = (macro_t *)0x1780ad;
      free(pcVar59);
      ppmStack_70 = (macro_t *)0x1780b5;
      free(pcVar57);
      unaff_R12->output_buffer = (VARR_token_t *)0x0;
      pcVar59 = pcVar57;
      goto LAB_001780c1;
    }
    goto LAB_00178923;
  }
LAB_001780c1:
  unaff_R13 = c2m_ctx->pre_ctx;
  pcVar37 = (c2m_ctx_t)unaff_R13->macros;
  if (pcVar37 != (c2m_ctx_t)0x0) {
    do {
      pMVar2 = pcVar37->ctx;
      pcVar57 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0];
      if (pMVar2 == (MIR_context_t)0x0) goto LAB_0017816a;
      pcVar59 = pcVar57;
      if (pcVar57 == (c2m_ctx_t)0x0) goto LAB_00178892;
      in_RCX = (MIR_context_t)((long)&pMVar2[-1].wrapper_end_addr + 7);
      pcVar37->ctx = in_RCX;
      pcVar57 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[(long)((long)&pMVar2[-1].wrapper_end_addr + 5)];
      unaff_R15 = (check_ctx *)((pos_t *)&pcVar57->options)->fname;
      if (unaff_R15 != (check_ctx *)0x0) {
        pcVar59 = (c2m_ctx_t)unaff_R15->func_block_scope;
        if (pcVar59 == (c2m_ctx_t)0x0) goto LAB_001788a1;
        ppmStack_70 = (macro_t *)0x178115;
        free(pcVar59);
        ppmStack_70 = (macro_t *)0x17811d;
        free(unaff_R15);
        ((pos_t *)&pcVar57->options)->fname = (char *)0x0;
      }
      unaff_R15 = (check_ctx *)pcVar57->env[0].__jmpbuf[0];
      if (unaff_R15 != (check_ctx *)0x0) {
        pcVar59 = (c2m_ctx_t)unaff_R15->func_block_scope;
        if (pcVar59 == (c2m_ctx_t)0x0) goto LAB_0017889c;
        ppmStack_70 = (macro_t *)0x178140;
        free(pcVar59);
        ppmStack_70 = (macro_t *)0x178148;
        free(unaff_R15);
        pcVar57->env[0].__jmpbuf[0] = 0;
      }
      ppmStack_70 = (macro_t *)0x178158;
      free(pcVar57);
      pcVar37 = (c2m_ctx_t)unaff_R13->macros;
    } while (pcVar37 != (c2m_ctx_t)0x0);
    ppmStack_70 = (macro_t *)0x17816a;
    compile_finish_cold_11();
LAB_0017816a:
    pcVar59 = pcVar57;
    if (pcVar57 != (c2m_ctx_t)0x0) {
      ppmStack_70 = (macro_t *)0x178178;
      free(pcVar57);
      ppmStack_70 = (macro_t *)0x178180;
      pcVar59 = pcVar37;
      free(pcVar37);
      unaff_R13->macros = (VARR_macro_t *)0x0;
      goto LAB_00178188;
    }
    goto LAB_00178941;
  }
LAB_00178188:
  unaff_R15 = (check_ctx *)unaff_R13->macro_tab;
  if (unaff_R15 == (check_ctx *)0x0) {
LAB_00178294:
    pcVar57 = (c2m_ctx_t)unaff_R12->ifs;
    if (pcVar57 != (c2m_ctx_t)0x0) {
      do {
        if (pcVar57->ctx == (MIR_context_t)0x0) goto LAB_001782bb;
        ppmStack_70 = (macro_t *)0x1782ac;
        pop_ifstate(c2m_ctx);
        pcVar57 = (c2m_ctx_t)unaff_R12->ifs;
      } while (pcVar57 != (c2m_ctx_t)0x0);
      ppmStack_70 = (macro_t *)0x1782bb;
      compile_finish_cold_18();
LAB_001782bb:
      pcVar59 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0];
      if (pcVar59 != (c2m_ctx_t)0x0) {
        ppmStack_70 = (macro_t *)0x1782cd;
        free(pcVar59);
        ppmStack_70 = (macro_t *)0x1782d5;
        free(pcVar57);
        unaff_R12->ifs = (VARR_ifstate_t *)0x0;
        goto LAB_001782de;
      }
      goto LAB_0017893c;
    }
LAB_001782de:
    pcVar57 = (c2m_ctx_t)unaff_R12->macro_call_stack;
    if (pcVar57 == (c2m_ctx_t)0x0) {
LAB_00178345:
      pcVar59 = (c2m_ctx_t)c2m_ctx->pre_ctx;
      ppmStack_70 = (macro_t *)0x178351;
      free(pcVar59);
      goto LAB_00178351;
    }
    do {
      pMVar2 = pcVar57->ctx;
      pcVar59 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0];
      if (pMVar2 == (MIR_context_t)0x0) goto LAB_00178323;
      if (pcVar59 == (c2m_ctx_t)0x0) goto LAB_00178897;
      in_RCX = (MIR_context_t)((long)&pMVar2[-1].wrapper_end_addr + 7);
      pcVar57->ctx = in_RCX;
      pcVar59 = (c2m_ctx_t)pcVar59->env[0].__jmpbuf[(long)((long)&pMVar2[-1].wrapper_end_addr + 5)];
      ppmStack_70 = (macro_t *)0x178311;
      free_macro_call((macro_call_t)pcVar59);
      pcVar57 = (c2m_ctx_t)unaff_R12->macro_call_stack;
    } while (pcVar57 != (c2m_ctx_t)0x0);
    ppmStack_70 = (macro_t *)0x178323;
    compile_finish_cold_20();
LAB_00178323:
    if (pcVar59 != (c2m_ctx_t)0x0) {
      ppmStack_70 = (macro_t *)0x178331;
      free(pcVar59);
      ppmStack_70 = (macro_t *)0x178339;
      free(pcVar57);
      unaff_R12->macro_call_stack = (VARR_macro_call_t *)0x0;
      goto LAB_00178345;
    }
    goto LAB_00178946;
  }
  if (unaff_R15->curr_switch == (node_t_conflict)0x0) {
LAB_00178222:
    unaff_R15 = (check_ctx *)unaff_R13->macro_tab;
    pcVar57 = (c2m_ctx_t)unaff_R15->func_decls_for_allocation;
    pcVar37 = pcVar57;
    if ((pcVar57 == (c2m_ctx_t)0x0) ||
       (pcVar59 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0], pcVar59 == (c2m_ctx_t)0x0))
    goto LAB_001788ec;
    ppmStack_70 = (macro_t *)0x178245;
    free(pcVar59);
    ppmStack_70 = (macro_t *)0x17824d;
    free(pcVar57);
    unaff_R15->func_decls_for_allocation = (VARR_decl_t *)0x0;
    unaff_R15 = (check_ctx *)unaff_R13->macro_tab;
    pcVar37 = (c2m_ctx_t)unaff_R15->possible_incomplete_decls;
    if ((pcVar37 != (c2m_ctx_t)0x0) &&
       (pcVar57 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0], pcVar57 != (c2m_ctx_t)0x0)) {
      ppmStack_70 = (macro_t *)0x178278;
      free(pcVar57);
      ppmStack_70 = (macro_t *)0x178280;
      free(pcVar37);
      unaff_R15->possible_incomplete_decls = (VARR_node_t *)0x0;
      ppmStack_70 = (macro_t *)0x178290;
      free(unaff_R13->macro_tab);
      unaff_R13->macro_tab = (HTAB_macro_t *)0x0;
      goto LAB_00178294;
    }
    goto LAB_001788f1;
  }
  if ((VARR_HTAB_EL_macro_t *)unaff_R15->func_decls_for_allocation == (VARR_HTAB_EL_macro_t *)0x0)
  goto LAB_0017894b;
  if (*(htab_size_t *)&unaff_R15->label_uses != 0) {
    in_RCX = (MIR_context_t)unaff_R15->func_block_scope;
    unaff_RBP = &((VARR_HTAB_EL_macro_t *)unaff_R15->func_decls_for_allocation)->varr->el;
    pcVar37 = (c2m_ctx_t)0x0;
    local_38 = in_RCX;
    do {
      if (((HTAB_EL_macro_t *)(unaff_RBP + -1))->hash != 0) {
        pcVar59 = (c2m_ctx_t)*unaff_RBP;
        ppmStack_70 = (macro_t *)0x1781db;
        in_RSI = local_38;
        (*(code *)unaff_R15->curr_switch)();
      }
      pcVar37 = (c2m_ctx_t)((long)&pcVar37->ctx + 1);
      unaff_RBP = unaff_RBP + 2;
    } while (pcVar37 < (c2m_ctx_t)(ulong)*(uint *)&unaff_R15->label_uses);
  }
  *(htab_size_t *)&unaff_R15->label_uses = 0;
  unaff_R15->curr_scope = (node_t_conflict)0x0;
  pVVar38 = unaff_R15->possible_incomplete_decls;
  if (pVVar38 != (VARR_node_t *)0x0) {
    in_RCX = (MIR_context_t)pVVar38->els_num;
    if ((int)in_RCX != 0) {
      pcVar59 = (c2m_ctx_t)pVVar38->varr;
      in_RSI = (MIR_context_t)0xff;
      ppmStack_70 = (macro_t *)0x178222;
      memset(pcVar59,0xff,((ulong)in_RCX & 0xffffffff) << 2);
    }
    goto LAB_00178222;
  }
  goto LAB_00178950;
code_r0x001784ac:
  in_RCX = (MIR_context_t)((long)&pMVar2[-1].wrapper_end_addr + 7);
  pcVar57->ctx = in_RCX;
  pcVar59 = (c2m_ctx_t)pcVar59->env[0].__jmpbuf[(long)((long)&pMVar2[-1].wrapper_end_addr + 5)];
  ppmStack_70 = (macro_t *)0x1784bd;
  free_stream((stream_t)pcVar59);
  pcVar57 = (c2m_ctx_t)c2m_ctx->streams;
  if (pcVar57 == (c2m_ctx_t)0x0) goto code_r0x001784c9;
  goto LAB_00178497;
LAB_0017a36f:
  compile_init_cold_19();
LAB_0017a374:
  compile_init_cold_17();
LAB_0017a379:
  compile_init_cold_15();
LAB_0017a37e:
  compile_init_cold_7();
LAB_0017a383:
  compile_init_cold_2();
LAB_0017a388:
  compile_init_cold_1();
LAB_0017a38d:
  compile_init_cold_6();
LAB_0017a392:
  compile_init_cold_5();
  goto LAB_0017a397;
LAB_0017a360:
  compile_init_cold_4();
  goto LAB_0017a365;
code_r0x001784c9:
  ppmStack_70 = (macro_t *)0x1784ce;
  compile_finish_cold_27();
LAB_001784ce:
  if (pcVar59 == (c2m_ctx_t)0x0) {
LAB_00178914:
    ppmStack_70 = (macro_t *)0x178919;
    compile_finish_cold_29();
LAB_00178919:
    ppmStack_70 = (macro_t *)0x17891e;
    compile_finish_cold_6();
LAB_0017891e:
    ppmStack_70 = (macro_t *)0x178923;
    compile_finish_cold_7();
LAB_00178923:
    ppmStack_70 = (macro_t *)0x178928;
    compile_finish_cold_8();
LAB_00178928:
    ppmStack_70 = (macro_t *)0x17892d;
    compile_finish_cold_33();
  }
  else {
    ppmStack_70 = (macro_t *)0x1784dc;
    free(pcVar59);
    ppmStack_70 = (macro_t *)0x1784e4;
    free(pcVar57);
    c2m_ctx->streams = (VARR_stream_t *)0x0;
LAB_001784ef:
    pcVar59 = (c2m_ctx_t)c2m_ctx->parse_ctx;
    ppmStack_70 = (macro_t *)0x1784fb;
    free(pcVar59);
LAB_001784fb:
    unaff_R15 = c2m_ctx->check_ctx;
    if (unaff_R15 == (check_ctx *)0x0) {
LAB_00178789:
      pcVar37 = (c2m_ctx_t)c2m_ctx->headers;
      if (pcVar37 != (c2m_ctx_t)0x0) {
        pcVar57 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0];
        if (pcVar57 != (c2m_ctx_t)0x0) {
          ppmStack_70 = (macro_t *)0x1787a7;
          free(pcVar57);
          ppmStack_70 = (macro_t *)0x1787af;
          free(pcVar37);
          c2m_ctx->headers = (VARR_char_ptr_t *)0x0;
          goto LAB_001787ba;
        }
        goto LAB_001788d3;
      }
LAB_001787ba:
      pcVar37 = (c2m_ctx_t)c2m_ctx->system_headers;
      if (pcVar37 != (c2m_ctx_t)0x0) {
        pcVar57 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0];
        if (pcVar57 != (c2m_ctx_t)0x0) {
          ppmStack_70 = (macro_t *)0x1787d8;
          free(pcVar57);
          ppmStack_70 = (macro_t *)0x1787e0;
          free(pcVar37);
          c2m_ctx->system_headers = (VARR_char_ptr_t *)0x0;
          goto LAB_001787eb;
        }
        goto LAB_001788d8;
      }
LAB_001787eb:
      pcVar37 = (c2m_ctx_t)c2m_ctx->call_nodes;
      if (pcVar37 != (c2m_ctx_t)0x0) {
        pcVar57 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0];
        if (pcVar57 != (c2m_ctx_t)0x0) {
          ppmStack_70 = (macro_t *)0x178809;
          free(pcVar57);
          ppmStack_70 = (macro_t *)0x178811;
          free(pcVar37);
          c2m_ctx->call_nodes = (VARR_node_t *)0x0;
          goto LAB_0017881c;
        }
        goto LAB_001788dd;
      }
LAB_0017881c:
      pcVar37 = (c2m_ctx_t)c2m_ctx->containing_anon_members;
      if (pcVar37 != (c2m_ctx_t)0x0) {
        pcVar57 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0];
        if (pcVar57 != (c2m_ctx_t)0x0) {
          ppmStack_70 = (macro_t *)0x17883a;
          free(pcVar57);
          ppmStack_70 = (macro_t *)0x178842;
          free(pcVar37);
          c2m_ctx->containing_anon_members = (VARR_node_t *)0x0;
          goto LAB_0017884d;
        }
        goto LAB_001788e2;
      }
LAB_0017884d:
      pcVar37 = (c2m_ctx_t)c2m_ctx->init_object_path;
      if (pcVar37 == (c2m_ctx_t)0x0) {
        return;
      }
      pcVar57 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0];
      if (pcVar57 != (c2m_ctx_t)0x0) {
        ppmStack_70 = (macro_t *)0x17886b;
        free(pcVar57);
        ppmStack_70 = (macro_t *)0x178873;
        free(pcVar37);
        c2m_ctx->init_object_path = (VARR_init_object_t *)0x0;
        return;
      }
      goto LAB_001788e7;
    }
    pcVar57 = (c2m_ctx_t)unaff_R15->context_stack;
    if (pcVar57 != (c2m_ctx_t)0x0) {
      pcVar59 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0];
      if (pcVar59 != (c2m_ctx_t)0x0) {
        ppmStack_70 = (macro_t *)0x178526;
        free(pcVar59);
        ppmStack_70 = (macro_t *)0x17852e;
        free(pcVar57);
        unaff_R15->context_stack = (VARR_node_t *)0x0;
        pcVar59 = pcVar57;
        goto LAB_00178536;
      }
      goto LAB_00178900;
    }
LAB_00178536:
    pcVar57 = (c2m_ctx_t)unaff_R15->label_uses;
    if (pcVar57 != (c2m_ctx_t)0x0) {
      pcVar59 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0];
      if (pcVar59 != (c2m_ctx_t)0x0) {
        ppmStack_70 = (macro_t *)0x178551;
        free(pcVar59);
        ppmStack_70 = (macro_t *)0x178559;
        pcVar59 = pcVar57;
        free(pcVar57);
        unaff_R15->label_uses = (VARR_node_t *)0x0;
        goto LAB_00178561;
      }
      goto LAB_00178905;
    }
LAB_00178561:
    unaff_R12 = (pre_ctx *)c2m_ctx->symbol_tab;
    if (unaff_R12 == (pre_ctx *)0x0) {
LAB_00178698:
      pcVar37 = (c2m_ctx_t)unaff_R15->case_tab;
      if (pcVar37 != (c2m_ctx_t)0x0) {
        if (pcVar37->env[0].__jmpbuf[3] != 0) {
          ppmStack_70 = (macro_t *)0x1786b1;
          HTAB_case_t_clear((HTAB_case_t *)pcVar37);
        }
        unaff_R12 = (pre_ctx *)unaff_R15->case_tab;
        pcVar57 = (c2m_ctx_t)unaff_R12->if_id;
        if ((pcVar57 == (c2m_ctx_t)0x0) ||
           (pcVar37 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0], pcVar37 == (c2m_ctx_t)0x0))
        goto LAB_001788b0;
        ppmStack_70 = (macro_t *)0x1786d5;
        free(pcVar37);
        ppmStack_70 = (macro_t *)0x1786dd;
        free(pcVar57);
        unaff_R12->if_id = (token_t)0x0;
        unaff_R12 = (pre_ctx *)unaff_R15->case_tab;
        pcVar37 = *(c2m_ctx_t *)unaff_R12->date_str;
        if ((pcVar37 == (c2m_ctx_t)0x0) ||
           (pcVar57 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0], pcVar57 == (c2m_ctx_t)0x0))
        goto LAB_001788ba;
        ppmStack_70 = (macro_t *)0x17870a;
        free(pcVar57);
        ppmStack_70 = (macro_t *)0x178712;
        free(pcVar37);
        unaff_R12->date_str[0] = '\0';
        unaff_R12->date_str[1] = '\0';
        unaff_R12->date_str[2] = '\0';
        unaff_R12->date_str[3] = '\0';
        unaff_R12->date_str[4] = '\0';
        unaff_R12->date_str[5] = '\0';
        unaff_R12->date_str[6] = '\0';
        unaff_R12->date_str[7] = '\0';
        ppmStack_70 = (macro_t *)0x178723;
        free(unaff_R15->case_tab);
        unaff_R15->case_tab = (HTAB_case_t *)0x0;
      }
      pcVar57 = (c2m_ctx_t)unaff_R15->func_decls_for_allocation;
      if (pcVar57 != (c2m_ctx_t)0x0) {
        pcVar59 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0];
        if (pcVar59 != (c2m_ctx_t)0x0) {
          ppmStack_70 = (macro_t *)0x178742;
          free(pcVar59);
          ppmStack_70 = (macro_t *)0x17874a;
          free(pcVar57);
          unaff_R15->func_decls_for_allocation = (VARR_decl_t *)0x0;
          goto LAB_00178752;
        }
        goto LAB_0017890a;
      }
LAB_00178752:
      pcVar57 = (c2m_ctx_t)unaff_R15->possible_incomplete_decls;
      if (pcVar57 == (c2m_ctx_t)0x0) {
LAB_0017877d:
        ppmStack_70 = (macro_t *)0x178789;
        free(c2m_ctx->check_ctx);
        goto LAB_00178789;
      }
      pcVar59 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0];
      if (pcVar59 != (c2m_ctx_t)0x0) {
        ppmStack_70 = (macro_t *)0x17876d;
        free(pcVar59);
        ppmStack_70 = (macro_t *)0x178775;
        free(pcVar57);
        unaff_R15->possible_incomplete_decls = (VARR_node_t *)0x0;
        goto LAB_0017877d;
      }
      goto LAB_0017890f;
    }
    lVar7._0_4_ = unaff_R12->no_out_p;
    lVar7._4_4_ = unaff_R12->skip_if_part_p;
    if (lVar7 == 0) {
LAB_00178616:
      unaff_R12 = (pre_ctx *)c2m_ctx->symbol_tab;
      pcVar37 = (c2m_ctx_t)unaff_R12->if_id;
      pcVar57 = pcVar37;
      if ((pcVar37 == (c2m_ctx_t)0x0) ||
         (pcVar59 = (c2m_ctx_t)pcVar37->env[0].__jmpbuf[0], pcVar59 == (c2m_ctx_t)0x0)) {
LAB_001788a6:
        pcVar37 = pcVar59;
        ppmStack_70 = (macro_t *)0x1788ab;
        compile_finish_cold_35();
      }
      else {
        ppmStack_70 = (macro_t *)0x17863d;
        free(pcVar59);
        ppmStack_70 = (macro_t *)0x178645;
        free(pcVar37);
        unaff_R12->if_id = (token_t)0x0;
        unaff_R12 = (pre_ctx *)c2m_ctx->symbol_tab;
        pcVar57 = *(c2m_ctx_t *)unaff_R12->date_str;
        if ((pcVar57 != (c2m_ctx_t)0x0) &&
           (pcVar37 = (c2m_ctx_t)pcVar57->env[0].__jmpbuf[0], pcVar37 != (c2m_ctx_t)0x0)) {
          ppmStack_70 = (macro_t *)0x178675;
          free(pcVar37);
          ppmStack_70 = (macro_t *)0x17867d;
          free(pcVar57);
          unaff_R12->date_str[0] = '\0';
          unaff_R12->date_str[1] = '\0';
          unaff_R12->date_str[2] = '\0';
          unaff_R12->date_str[3] = '\0';
          unaff_R12->date_str[4] = '\0';
          unaff_R12->date_str[5] = '\0';
          unaff_R12->date_str[6] = '\0';
          unaff_R12->date_str[7] = '\0';
          ppmStack_70 = (macro_t *)0x178691;
          free(c2m_ctx->symbol_tab);
          c2m_ctx->symbol_tab = (HTAB_symbol_t *)0x0;
          goto LAB_00178698;
        }
      }
      ppmStack_70 = (macro_t *)0x1788b0;
      compile_finish_cold_34();
LAB_001788b0:
      ppmStack_70 = (macro_t *)0x1788b5;
      compile_finish_cold_37();
      pcVar59 = pcVar37;
      pcVar37 = pcVar57;
LAB_001788b5:
      pcVar57 = pcVar59;
      ppmStack_70 = (macro_t *)0x1788ba;
      compile_finish_cold_26();
LAB_001788ba:
      ppmStack_70 = (macro_t *)0x1788bf;
      compile_finish_cold_36();
LAB_001788bf:
      ppmStack_70 = (macro_t *)0x1788c4;
      compile_finish_cold_25();
      goto LAB_001788c4;
    }
    if (unaff_R12->if_id == (token_t)0x0) goto LAB_00178928;
    if (*(int *)&unaff_R12->temp_tokens != 0) {
      pcVar57 = (c2m_ctx_t)unaff_R12->macro_tab;
      unaff_R13 = (pre_ctx *)(*(long *)&(unaff_R12->if_id->pos).lno + 8);
      unaff_RBP = (macro_t *)0x0;
      do {
        if (*(int *)((long)unaff_R13 + -8) != 0) {
          local_68 = unaff_R13->once_include_files;
          uStack_60 = *(undefined8 *)((long)unaff_R13 + 8);
          uStack_58 = *(undefined8 *)((long)unaff_R13 + 0x10);
          uStack_50 = *(undefined8 *)((long)unaff_R13 + 0x18);
          uStack_48 = *(undefined8 *)((long)unaff_R13 + 0x20);
          uStack_40 = *(undefined8 *)((long)unaff_R13 + 0x28);
          ppmStack_70 = (macro_t *)0x1785cb;
          pcVar59 = pcVar57;
          (**(code **)&unaff_R12->no_out_p)();
        }
        unaff_RBP = (macro_t *)((long)unaff_RBP + 1);
        unaff_R13 = (pre_ctx *)((long)unaff_R13 + 0x38);
      } while (unaff_RBP < (undefined8 *)(ulong)*(uint *)&unaff_R12->temp_tokens);
    }
    *(undefined4 *)&unaff_R12->temp_tokens = 0;
    unaff_R12->once_include_files = (VARR_char_ptr_t *)0x0;
    puVar3 = *(undefined8 **)unaff_R12->date_str;
    if (puVar3 != (undefined8 *)0x0) {
      in_RCX = (MIR_context_t)*puVar3;
      if ((int)in_RCX != 0) {
        pcVar59 = (c2m_ctx_t)puVar3[2];
        in_RSI = (MIR_context_t)0xff;
        ppmStack_70 = (macro_t *)0x178616;
        memset(pcVar59,0xff,((ulong)in_RCX & 0xffffffff) << 2);
      }
      goto LAB_00178616;
    }
  }
  ppmStack_70 = (macro_t *)0x178932;
  compile_finish_cold_32();
LAB_00178932:
  ppmStack_70 = (macro_t *)0x178937;
  compile_finish_cold_24();
LAB_00178937:
  ppmStack_70 = (macro_t *)0x17893c;
  compile_finish_cold_23();
LAB_0017893c:
  ppmStack_70 = (macro_t *)0x178941;
  compile_finish_cold_19();
  pcVar37 = pcVar57;
LAB_00178941:
  pcVar57 = pcVar37;
  ppmStack_70 = (macro_t *)0x178946;
  compile_finish_cold_13();
LAB_00178946:
  ppmStack_70 = (macro_t *)0x17894b;
  compile_finish_cold_22();
  pcVar37 = pcVar57;
LAB_0017894b:
  ppmStack_70 = (macro_t *)0x178950;
  compile_finish_cold_15();
LAB_00178950:
  ppmStack_70 = (macro_t *)compile_init;
  compile_finish_cold_14();
  pcVar59->options = (c2mir_options *)in_RSI;
  pcVar59->n_errors = 0;
  pcVar59->n_warnings = 0;
  pcVar59->c_getc = extraout_RDX;
  pcVar59->c_getc_data = in_RCX;
  pptVar58 = (token_t *)&DAT_00000018;
  pcStack_98 = c2m_ctx;
  ppStack_90 = unaff_R12;
  ppStack_88 = unaff_R13;
  pcStack_80 = pcVar37;
  pcStack_78 = unaff_R15;
  ppmStack_70 = unaff_RBP;
  pVVar8 = (VARR_char *)malloc(0x18);
  pcVar59->symbol_text = pVVar8;
  if (pVVar8 == (VARR_char *)0x0) goto LAB_0017a365;
  pVVar8->els_num = 0;
  pVVar8->size = 0x80;
  pcVar9 = (char *)malloc(0x80);
  pVVar8->varr = pcVar9;
  pptVar58 = (token_t *)&DAT_00000018;
  pVVar8 = (VARR_char *)malloc(0x18);
  pcVar59->temp_string = pVVar8;
  if (pVVar8 == (VARR_char *)0x0) goto LAB_0017a365;
  pVVar8->els_num = 0;
  pVVar8->size = 0x80;
  pcVar9 = (char *)malloc(0x80);
  pVVar8->varr = pcVar9;
  pptVar58 = (token_t *)&DAT_00000018;
  pVVar10 = (VARR_pos_t *)malloc(0x18);
  pcVar59->node_positions = pVVar10;
  if (pVVar10 == (VARR_pos_t *)0x0) goto LAB_0017a365;
  pVVar10->els_num = 0;
  pVVar10->size = 0x80;
  ppVar11 = (pos_t *)malloc(0x800);
  pVVar10->varr = ppVar11;
  ppVar12 = (parse_ctx *)c2mir_calloc(pcVar59,0x28);
  pcVar59->parse_ctx = ppVar12;
  ppVar12->curr_scope = (node_t_conflict)0x0;
  pcVar59->error_func = fatal_error;
  ppVar12->record_level = 0;
  pcVar59->curr_uid = 0;
  pptVar58 = (token_t *)&DAT_00000018;
  pVVar13 = (VARR_stream_t *)malloc(0x18);
  pcVar59->cs = (stream_t)0x0;
  pcVar59->eof_s = (stream_t)0x0;
  pcVar59->streams = pVVar13;
  if (pVVar13 == (VARR_stream_t *)0x0) goto LAB_0017a365;
  pVVar13->els_num = 0;
  pVVar13->size = 0x20;
  ppsVar14 = (stream_t *)malloc(0x100);
  pVVar13->varr = ppsVar14;
  pptVar58 = (token_t *)&DAT_00000018;
  pVVar15 = (VARR_token_t *)malloc(0x18);
  pcVar59->recorded_tokens = pVVar15;
  if (pVVar15 == (VARR_token_t *)0x0) goto LAB_0017a365;
  pVVar15->els_num = 0;
  pVVar15->size = 0x20;
  pptVar58 = (token_t *)malloc(0x100);
  pVVar15->varr = pptVar58;
  pptVar58 = (token_t *)&DAT_00000018;
  pVVar15 = (VARR_token_t *)malloc(0x18);
  pcVar59->buffered_tokens = pVVar15;
  if (pVVar15 == (VARR_token_t *)0x0) goto LAB_0017a365;
  pVVar15->els_num = 0;
  pVVar15->size = 0x20;
  pptVar58 = (token_t *)malloc(0x100);
  pVVar15->varr = pptVar58;
  ppVar16 = (pre_ctx *)c2mir_calloc(pcVar59,0x140);
  pcVar59->pre_ctx = ppVar16;
  ppVar16->no_out_p = 0;
  ppVar16->skip_if_part_p = 0;
  pmStack_c0 = (macro_t)time(&tStack_a0);
  __tp = localtime_r((time_t *)&pmStack_c0,&tStack_f8);
  if (__tp == (tm *)0x0) {
    builtin_strncpy(ppVar16->date_str_repr,"\"Unknown date\"",0xf);
    __tp = (tm *)0x22656d6974206e;
    builtin_strncpy(ppVar16->time_str_repr,"\"Unknown time\"",0xf);
  }
  else {
    strftime(ppVar16->date_str_repr,0x32,"\"%b %d %Y\"",__tp);
    strftime(ppVar16->time_str_repr,0x32,"\"%H:%M:%S\"",__tp);
  }
  strcpy(ppVar16->date_str,ppVar16->date_str_repr + 1);
  sVar17 = strlen(ppVar16->date_str);
  ppVar16->date_str[sVar17 - 1] = '\0';
  pcVar37 = (c2m_ctx_t)(ppVar16->time_str_repr + 1);
  strcpy(ppVar16->time_str,(char *)pcVar37);
  sVar17 = strlen(ppVar16->time_str);
  ppVar16->date_str[sVar17 + 0x31] = '\0';
  pptVar58 = (token_t *)&DAT_00000018;
  pVVar18 = (VARR_char_ptr_t *)malloc(0x18);
  ppVar16->once_include_files = pVVar18;
  if (pVVar18 == (VARR_char_ptr_t *)0x0) goto LAB_0017a365;
  pVVar18->els_num = 0;
  pVVar18->size = 0x40;
  ppcVar19 = (char_ptr_t *)malloc(0x200);
  pVVar18->varr = ppcVar19;
  pptVar58 = (token_t *)&DAT_00000018;
  pVVar15 = (VARR_token_t *)malloc(0x18);
  ppVar16->temp_tokens = pVVar15;
  if (pVVar15 == (VARR_token_t *)0x0) goto LAB_0017a365;
  pVVar15->els_num = 0;
  pVVar15->size = 0x80;
  pptVar58 = (token_t *)malloc(0x400);
  pVVar15->varr = pptVar58;
  pptVar58 = (token_t *)&DAT_00000018;
  pVVar15 = (VARR_token_t *)malloc(0x18);
  ppVar16->output_buffer = pVVar15;
  if (pVVar15 == (VARR_token_t *)0x0) goto LAB_0017a365;
  pVVar15->els_num = 0;
  pVVar15->size = 0x800;
  pptVar58 = (token_t *)malloc(0x4000);
  pVVar15->varr = pptVar58;
  ppVar4 = pcVar59->pre_ctx;
  pptVar58 = (token_t *)&DAT_00000018;
  pcStack_b8 = pcVar59;
  pVVar20 = (VARR_macro_t *)malloc(0x18);
  ppVar4->macros = pVVar20;
  if (pVVar20 == (VARR_macro_t *)0x0) goto LAB_0017a365;
  pVVar20->els_num = 0;
  pVVar20->size = 0x800;
  ppmVar21 = (macro_t *)malloc(0x4000);
  pVVar20->varr = ppmVar21;
  pcVar59 = (c2m_ctx_t)0x40;
  pHVar22 = (HTAB_macro_t *)malloc(0x40);
  if (pHVar22 == (HTAB_macro_t *)0x0) goto LAB_0017a397;
  pptVar58 = (token_t *)&DAT_00000018;
  pVVar23 = (VARR_HTAB_EL_macro_t *)malloc(0x18);
  pHVar22->els = pVVar23;
  if (pVVar23 == (VARR_HTAB_EL_macro_t *)0x0) goto LAB_0017a365;
  pVVar23->els_num = 0;
  pVVar23->size = 0x800;
  pptVar58 = (token_t *)0x8000;
  pHVar24 = (HTAB_EL_macro_t *)malloc(0x8000);
  pVVar23->varr = pHVar24;
  if (pHVar24 == (HTAB_EL_macro_t *)0x0) {
    compile_init_cold_24();
LAB_0017a3a1:
    compile_init_cold_20();
LAB_0017a3a6:
    compile_init_cold_18();
LAB_0017a3ab:
    compile_init_cold_16();
LAB_0017a3b0:
    compile_init_cold_14();
LAB_0017a3b5:
    compile_init_cold_13();
LAB_0017a3ba:
    compile_init_cold_12();
LAB_0017a3bf:
    compile_init_cold_11();
LAB_0017a3c4:
    compile_init_cold_10();
LAB_0017a3c9:
    compile_init_cold_9();
LAB_0017a3ce:
    compile_init_cold_8();
  }
  else {
    pVVar23->size = 0x800;
    pVVar23->els_num = 0x800;
    pptVar58 = (token_t *)&DAT_00000018;
    pVVar25 = (VARR_htab_ind_t *)malloc(0x18);
    pHVar22->entries = pVVar25;
    if (pVVar25 == (VARR_htab_ind_t *)0x0) goto LAB_0017a365;
    pVVar25->els_num = 0;
    pVVar25->size = 0x1000;
    phVar26 = (htab_ind_t *)malloc(0x4000);
    pVVar25->varr = phVar26;
    pHVar22->arg = (void *)0x0;
    pHVar22->hash_func = macro_hash;
    pHVar22->eq_func = macro_eq;
    pHVar22->free_func = (_func_void_macro_t_void_ptr *)0x0;
    pHVar22->els_num = 0;
    pHVar22->els_start = 0;
    pHVar22->els_bound = 0;
    pHVar22->collisions = 0;
    iVar56 = 0x1000;
    do {
      pVVar25 = pHVar22->entries;
      pcVar59 = (c2m_ctx_t)pVVar25->varr;
      if (pcVar59 == (c2m_ctx_t)0x0) {
        compile_init_cold_23();
        goto LAB_0017a36f;
      }
      uVar27 = pVVar25->els_num + 1;
      if (pVVar25->size < uVar27) {
        sVar55 = (uVar27 >> 1) + uVar27;
        phVar26 = (htab_ind_t *)realloc(pcVar59,sVar55 * 4);
        pVVar25->varr = phVar26;
        pVVar25->size = sVar55;
      }
      pcVar57 = pcStack_b8;
      sVar55 = pVVar25->els_num;
      pVVar25->els_num = sVar55 + 1;
      pVVar25->varr[sVar55] = 0xffffffff;
      iVar56 = iVar56 + -1;
    } while (iVar56 != 0);
    ppVar4->macro_tab = pHVar22;
    ptVar28 = new_id_token(pcStack_b8,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__DATE__");
    new_macro(pcVar57,ptVar28,(VARR_token_t *)0x0,(VARR_token_t *)0x0);
    ptVar28 = new_id_token(pcVar57,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__TIME__");
    new_macro(pcVar57,ptVar28,(VARR_token_t *)0x0,(VARR_token_t *)0x0);
    ptVar28 = new_id_token(pcVar57,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__FILE__");
    new_macro(pcVar57,ptVar28,(VARR_token_t *)0x0,(VARR_token_t *)0x0);
    ptVar28 = new_id_token(pcVar57,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__LINE__");
    new_macro(pcVar57,ptVar28,(VARR_token_t *)0x0,(VARR_token_t *)0x0);
    if (pcVar57->options->pedantic_p != 0) {
LAB_00179040:
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar29 = (VARR_ifstate_t *)malloc(0x18);
      ppVar16->ifs = pVVar29;
      if (pVVar29 == (VARR_ifstate_t *)0x0) {
LAB_0017a365:
        mir_varr_error((char *)pptVar58);
      }
      pVVar29->els_num = 0;
      pVVar29->size = 0x200;
      ppiVar30 = (ifstate_t *)malloc(0x1000);
      pVVar29->varr = ppiVar30;
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar31 = (VARR_macro_call_t *)malloc(0x18);
      ppVar16->macro_call_stack = pVVar31;
      if (pVVar31 == (VARR_macro_call_t *)0x0) goto LAB_0017a365;
      pVVar31->els_num = 0;
      pVVar31->size = 0x200;
      ppmVar32 = (macro_call_t *)malloc(0x1000);
      pVVar31->varr = ppmVar32;
      str_add((tab_str_t *)&tStack_f8,pcVar57,"_Bool",6,0x110,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"_Complex",9,0x111,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"_Alignas",9,0x113,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"_Alignof",9,0x112,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"_Atomic",8,0x114,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"_Generic",9,0x115,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"_Noreturn",10,0x116,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"_Static_assert",0xf,0x117,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"_Thread_local",0xe,0x118,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"auto",5,0x11a,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"break",6,0x11b,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"case",5,0x11c,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"char",5,0x11d,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"const",6,0x11e,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"continue",9,0x11f,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"default",8,0x120,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"do",3,0x121,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"double",7,0x122,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"else",5,0x123,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"enum",5,0x124,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"extern",7,0x125,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"float",6,0x126,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"for",4,0x127,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"goto",5,0x128,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"if",3,0x129,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"inline",7,0x12a,3,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"int",4,299,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"long",5,300,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"register",9,0x12d,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"restrict",9,0x12e,2,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"return",7,0x12f,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"short",6,0x130,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"signed",7,0x131,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"sizeof",7,0x132,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"static",7,0x133,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"struct",7,0x134,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"switch",7,0x135,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"typedef",8,0x136,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"typeof",7,0x137,1,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"union",6,0x138,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"unsigned",9,0x139,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"void",5,0x13a,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"volatile",9,0x13b,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"while",6,0x13c,0,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"__restrict",0xb,0x12e,1,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"__restrict__",0xd,0x12e,1,1);
      str_add((tab_str_t *)&tStack_f8,pcVar57,"__inline",9,0x12a,1,1);
      __tp = (tm *)0xb;
      pcVar37 = pcVar57;
      str_add((tab_str_t *)&tStack_f8,pcVar57,"__inline__",0xb,0x12a,1,1);
      ppVar12 = pcVar57->parse_ctx;
      pcVar59 = (c2m_ctx_t)0x40;
      pHVar33 = (HTAB_tpname_t *)malloc(0x40);
      if (pHVar33 == (HTAB_tpname_t *)0x0) goto LAB_0017a397;
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar34 = (VARR_HTAB_EL_tpname_t *)malloc(0x18);
      pHVar33->els = pVVar34;
      if (pVVar34 == (VARR_HTAB_EL_tpname_t *)0x0) goto LAB_0017a365;
      pVVar34->els_num = 0;
      pVVar34->size = 0x400;
      pptVar58 = (token_t *)0x8000;
      pHVar35 = (HTAB_EL_tpname_t *)malloc(0x8000);
      pVVar34->varr = pHVar35;
      if (pHVar35 == (HTAB_EL_tpname_t *)0x0) goto LAB_0017a3a1;
      pVVar34->size = 0x400;
      pVVar34->els_num = 0x400;
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar25 = (VARR_htab_ind_t *)malloc(0x18);
      pHVar33->entries = pVVar25;
      if (pVVar25 == (VARR_htab_ind_t *)0x0) goto LAB_0017a365;
      pVVar25->els_num = 0;
      pVVar25->size = 0x800;
      phVar26 = (htab_ind_t *)malloc(0x2000);
      pVVar25->varr = phVar26;
      pHVar33->arg = (void *)0x0;
      pHVar33->hash_func = tpname_hash;
      pHVar33->eq_func = tpname_eq;
      pHVar33->free_func = (_func_void_tpname_t_void_ptr *)0x0;
      pHVar33->els_num = 0;
      pHVar33->els_start = 0;
      pHVar33->els_bound = 0;
      pHVar33->collisions = 0;
      iVar56 = 0x800;
      do {
        pVVar25 = pHVar33->entries;
        pcVar59 = (c2m_ctx_t)pVVar25->varr;
        if (pcVar59 == (c2m_ctx_t)0x0) goto LAB_0017a36f;
        uVar27 = pVVar25->els_num + 1;
        if (pVVar25->size < uVar27) {
          sVar55 = (uVar27 >> 1) + uVar27;
          phVar26 = (htab_ind_t *)realloc(pcVar59,sVar55 * 4);
          pVVar25->varr = phVar26;
          pVVar25->size = sVar55;
        }
        sVar55 = pVVar25->els_num;
        pVVar25->els_num = sVar55 + 1;
        pVVar25->varr[sVar55] = 0xffffffff;
        iVar56 = iVar56 + -1;
      } while (iVar56 != 0);
      ppVar12->tpname_tab = pHVar33;
      pcVar36 = (check_ctx *)c2mir_calloc(pcVar57,0x78);
      pcVar57->check_ctx = pcVar36;
      pcVar37 = (c2m_ctx_t)new_node(pcVar57,N_I);
      __tp = (tm *)0xffffffffffffffff;
      add_pos(pcVar57,(node_t_conflict)pcVar37,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40));
      pcVar37->env[0].__jmpbuf[2] = 1;
      pcVar36->n_i1_node = (node_t_conflict)pcVar37;
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar38 = (VARR_node_t *)malloc(0x18);
      pcVar36->context_stack = pVVar38;
      if (pVVar38 == (VARR_node_t *)0x0) goto LAB_0017a365;
      pVVar38->els_num = 0;
      pVVar38->size = 0x40;
      ppnVar39 = (node_t_conflict *)malloc(0x200);
      pVVar38->varr = ppnVar39;
      check(pcVar57,(node_t_conflict)pcVar37,(node_t_conflict)0x0);
      pcVar36->curr_scope = (node_t_conflict)0x0;
      pcVar36->func_block_scope = (node_t_conflict)0x0;
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar38 = (VARR_node_t *)malloc(0x18);
      pcVar36->label_uses = pVVar38;
      if (pVVar38 == (VARR_node_t *)0x0) goto LAB_0017a365;
      pVVar38->els_num = 0;
      pVVar38->size = 0x40;
      ppnVar39 = (node_t_conflict *)malloc(0x200);
      pVVar38->varr = ppnVar39;
      pcVar59 = (c2m_ctx_t)0x40;
      pHVar40 = (HTAB_symbol_t *)malloc(0x40);
      if (pHVar40 == (HTAB_symbol_t *)0x0) {
LAB_0017a397:
        mir_htab_error((char *)pcVar59);
      }
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar41 = (VARR_HTAB_EL_symbol_t *)malloc(0x18);
      pHVar40->els = pVVar41;
      if (pVVar41 == (VARR_HTAB_EL_symbol_t *)0x0) goto LAB_0017a365;
      pVVar41->els_num = 0;
      pVVar41->size = 0x2000;
      pptVar58 = (token_t *)0x70000;
      pHVar42 = (HTAB_EL_symbol_t *)malloc(0x70000);
      pVVar41->varr = pHVar42;
      if (pHVar42 == (HTAB_EL_symbol_t *)0x0) goto LAB_0017a3a6;
      pVVar41->size = 0x2000;
      pVVar41->els_num = 0x2000;
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar25 = (VARR_htab_ind_t *)malloc(0x18);
      pHVar40->entries = pVVar25;
      if (pVVar25 == (VARR_htab_ind_t *)0x0) goto LAB_0017a365;
      pVVar25->els_num = 0;
      pVVar25->size = 0x4000;
      phVar26 = (htab_ind_t *)malloc(0x10000);
      pVVar25->varr = phVar26;
      pHVar40->arg = (void *)0x0;
      pHVar40->hash_func = symbol_hash;
      pHVar40->eq_func = symbol_eq;
      pHVar40->free_func = symbol_clear;
      pHVar40->els_num = 0;
      pHVar40->els_start = 0;
      pHVar40->els_bound = 0;
      pHVar40->collisions = 0;
      iVar56 = 0x4000;
      do {
        pVVar25 = pHVar40->entries;
        pcVar59 = (c2m_ctx_t)pVVar25->varr;
        if (pcVar59 == (c2m_ctx_t)0x0) goto LAB_0017a374;
        uVar27 = pVVar25->els_num + 1;
        if (pVVar25->size < uVar27) {
          sVar55 = (uVar27 >> 1) + uVar27;
          pcVar37 = (c2m_ctx_t)(sVar55 * 4);
          phVar26 = (htab_ind_t *)realloc(pcVar59,(size_t)pcVar37);
          pVVar25->varr = phVar26;
          pVVar25->size = sVar55;
        }
        sVar55 = pVVar25->els_num;
        __tp = (tm *)pVVar25->varr;
        pVVar25->els_num = sVar55 + 1;
        (&__tp->tm_sec)[sVar55] = -1;
        iVar56 = iVar56 + -1;
      } while (iVar56 != 0);
      pcVar57->symbol_tab = pHVar40;
      pcVar36->in_params_p = '\0';
      pcVar36->curr_unnamed_anon_struct_union_member = (node_t_conflict)0x0;
      pcVar59 = (c2m_ctx_t)0x40;
      pHVar43 = (HTAB_case_t *)malloc(0x40);
      if (pHVar43 == (HTAB_case_t *)0x0) goto LAB_0017a397;
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar44 = (VARR_HTAB_EL_case_t *)malloc(0x18);
      pHVar43->els = pVVar44;
      if (pVVar44 == (VARR_HTAB_EL_case_t *)0x0) goto LAB_0017a365;
      pVVar44->els_num = 0;
      pVVar44->size = 0x80;
      pptVar58 = (token_t *)0x800;
      pHVar45 = (HTAB_EL_case_t *)malloc(0x800);
      pVVar44->varr = pHVar45;
      if (pHVar45 == (HTAB_EL_case_t *)0x0) goto LAB_0017a3ab;
      pVVar44->size = 0x80;
      pVVar44->els_num = 0x80;
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar25 = (VARR_htab_ind_t *)malloc(0x18);
      pHVar43->entries = pVVar25;
      if (pVVar25 == (VARR_htab_ind_t *)0x0) goto LAB_0017a365;
      pVVar25->els_num = 0;
      pVVar25->size = 0x100;
      phVar26 = (htab_ind_t *)malloc(0x400);
      pVVar25->varr = phVar26;
      pHVar43->arg = (void *)0x0;
      pHVar43->hash_func = case_hash;
      pHVar43->eq_func = case_eq;
      pHVar43->free_func = (_func_void_case_t_void_ptr *)0x0;
      pHVar43->els_num = 0;
      pHVar43->els_start = 0;
      pHVar43->els_bound = 0;
      pHVar43->collisions = 0;
      iVar56 = 0x100;
      do {
        pVVar25 = pHVar43->entries;
        pcVar59 = (c2m_ctx_t)pVVar25->varr;
        if (pcVar59 == (c2m_ctx_t)0x0) goto LAB_0017a379;
        uVar27 = pVVar25->els_num + 1;
        if (pVVar25->size < uVar27) {
          sVar55 = (uVar27 >> 1) + uVar27;
          pcVar37 = (c2m_ctx_t)(sVar55 * 4);
          phVar26 = (htab_ind_t *)realloc(pcVar59,(size_t)pcVar37);
          pVVar25->varr = phVar26;
          pVVar25->size = sVar55;
        }
        sVar55 = pVVar25->els_num;
        __tp = (tm *)pVVar25->varr;
        pVVar25->els_num = sVar55 + 1;
        (&__tp->tm_sec)[sVar55] = -1;
        iVar56 = iVar56 + -1;
      } while (iVar56 != 0);
      pcVar36->case_tab = pHVar43;
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar46 = (VARR_decl_t *)malloc(0x18);
      pcVar36->func_decls_for_allocation = pVVar46;
      if (pVVar46 == (VARR_decl_t *)0x0) goto LAB_0017a365;
      pVVar46->els_num = 0;
      pVVar46->size = 0x400;
      ppdVar47 = (decl_t *)malloc(0x2000);
      pVVar46->varr = ppdVar47;
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar38 = (VARR_node_t *)malloc(0x18);
      pcVar36->possible_incomplete_decls = pVVar38;
      if (pVVar38 == (VARR_node_t *)0x0) goto LAB_0017a365;
      pVVar38->els_num = 0;
      pVVar38->size = 0x200;
      ppnVar39 = (node_t_conflict *)malloc(0x1000);
      pVVar38->varr = ppnVar39;
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar18 = (VARR_char_ptr_t *)malloc(0x18);
      pcVar57->headers = pVVar18;
      if (pVVar18 == (VARR_char_ptr_t *)0x0) goto LAB_0017a365;
      pVVar18->els_num = 0;
      pVVar18->size = 0x40;
      ppcVar19 = (char_ptr_t *)malloc(0x200);
      pVVar18->varr = ppcVar19;
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar18 = (VARR_char_ptr_t *)malloc(0x18);
      pcVar57->system_headers = pVVar18;
      if (pVVar18 == (VARR_char_ptr_t *)0x0) goto LAB_0017a365;
      pVVar18->els_num = 0;
      pVVar18->size = 0x40;
      ppcVar19 = (char_ptr_t *)malloc(0x200);
      pVVar18->varr = ppcVar19;
      pcVar49 = pcVar57->options;
      if (pcVar49->include_dirs_num != 0) {
        uVar27 = 0;
        do {
          pVVar18 = pcVar57->headers;
          pcVar59 = (c2m_ctx_t)pVVar18->varr;
          if (pcVar59 == (c2m_ctx_t)0x0) goto LAB_0017a383;
          pcVar9 = pcVar49->include_dirs[uVar27];
          uVar48 = pVVar18->els_num + 1;
          if (pVVar18->size < uVar48) {
            sVar55 = (uVar48 >> 1) + uVar48;
            pcVar37 = (c2m_ctx_t)(sVar55 * 8);
            ppcVar19 = (char_ptr_t *)realloc(pcVar59,(size_t)pcVar37);
            pVVar18->varr = ppcVar19;
            pVVar18->size = sVar55;
          }
          sVar55 = pVVar18->els_num;
          pVVar18->els_num = sVar55 + 1;
          pVVar18->varr[sVar55] = pcVar9;
          pVVar18 = pcVar57->system_headers;
          pcVar59 = (c2m_ctx_t)pVVar18->varr;
          if (pcVar59 == (c2m_ctx_t)0x0) goto LAB_0017a388;
          pcVar9 = pcVar57->options->include_dirs[uVar27];
          uVar48 = pVVar18->els_num + 1;
          if (pVVar18->size < uVar48) {
            sVar55 = (uVar48 >> 1) + uVar48;
            pcVar37 = (c2m_ctx_t)(sVar55 * 8);
            ppcVar19 = (char_ptr_t *)realloc(pcVar59,(size_t)pcVar37);
            pVVar18->varr = ppcVar19;
            pVVar18->size = sVar55;
          }
          sVar55 = pVVar18->els_num;
          __tp = (tm *)pVVar18->varr;
          pVVar18->els_num = sVar55 + 1;
          *(char **)(&__tp->tm_sec + sVar55 * 2) = pcVar9;
          uVar27 = uVar27 + 1;
          pcVar49 = pcVar57->options;
        } while (uVar27 < pcVar49->include_dirs_num);
      }
      pVVar18 = pcVar57->headers;
      pptVar58 = (token_t *)pVVar18->varr;
      if (pptVar58 == (token_t *)0x0) goto LAB_0017a3b0;
      uVar27 = pVVar18->els_num + 1;
      if (pVVar18->size < uVar27) {
        sVar55 = (uVar27 >> 1) + uVar27;
        pcVar37 = (c2m_ctx_t)(sVar55 * 8);
        ppcVar19 = (char_ptr_t *)realloc(pptVar58,(size_t)pcVar37);
        pVVar18->varr = ppcVar19;
        pVVar18->size = sVar55;
      }
      sVar55 = pVVar18->els_num;
      __tp = (tm *)pVVar18->varr;
      pVVar18->els_num = sVar55 + 1;
      *(undefined8 *)(&__tp->tm_sec + sVar55 * 2) = 0;
      pVVar18 = pcVar57->system_headers;
      pptVar58 = (token_t *)pVVar18->varr;
      if (pptVar58 == (token_t *)0x0) goto LAB_0017a3b5;
      uVar27 = pVVar18->els_num + 1;
      if (pVVar18->size < uVar27) {
        sVar55 = (uVar27 >> 1) + uVar27;
        pcVar37 = (c2m_ctx_t)(sVar55 * 8);
        ppcVar19 = (char_ptr_t *)realloc(pptVar58,(size_t)pcVar37);
        pVVar18->varr = ppcVar19;
        pVVar18->size = sVar55;
      }
      sVar55 = pVVar18->els_num;
      __tp = (tm *)pVVar18->varr;
      pVVar18->els_num = sVar55 + 1;
      *(char **)(&__tp->tm_sec + sVar55 * 2) = "/usr/local/include";
      pVVar18 = pcVar57->system_headers;
      pptVar58 = (token_t *)pVVar18->varr;
      if (pptVar58 == (token_t *)0x0) goto LAB_0017a3ba;
      uVar27 = pVVar18->els_num + 1;
      if (pVVar18->size < uVar27) {
        sVar55 = (uVar27 >> 1) + uVar27;
        pcVar37 = (c2m_ctx_t)(sVar55 * 8);
        ppcVar19 = (char_ptr_t *)realloc(pptVar58,(size_t)pcVar37);
        pVVar18->varr = ppcVar19;
        pVVar18->size = sVar55;
      }
      sVar55 = pVVar18->els_num;
      __tp = (tm *)pVVar18->varr;
      pVVar18->els_num = sVar55 + 1;
      *(char **)(&__tp->tm_sec + sVar55 * 2) = "/usr/include/x86_64-linux-gnu";
      pVVar18 = pcVar57->system_headers;
      pptVar58 = (token_t *)pVVar18->varr;
      if (pptVar58 == (token_t *)0x0) goto LAB_0017a3bf;
      uVar27 = pVVar18->els_num + 1;
      if (pVVar18->size < uVar27) {
        sVar55 = (uVar27 >> 1) + uVar27;
        pcVar37 = (c2m_ctx_t)(sVar55 * 8);
        ppcVar19 = (char_ptr_t *)realloc(pptVar58,(size_t)pcVar37);
        pVVar18->varr = ppcVar19;
        pVVar18->size = sVar55;
      }
      sVar55 = pVVar18->els_num;
      __tp = (tm *)pVVar18->varr;
      pVVar18->els_num = sVar55 + 1;
      *(char **)(&__tp->tm_sec + sVar55 * 2) = "/usr/include";
      pVVar18 = pcVar57->system_headers;
      pptVar58 = (token_t *)pVVar18->varr;
      if (pptVar58 == (token_t *)0x0) goto LAB_0017a3c4;
      uVar27 = pVVar18->els_num + 1;
      if (pVVar18->size < uVar27) {
        sVar55 = (uVar27 >> 1) + uVar27;
        pcVar37 = (c2m_ctx_t)(sVar55 * 8);
        ppcVar19 = (char_ptr_t *)realloc(pptVar58,(size_t)pcVar37);
        pVVar18->varr = ppcVar19;
        pVVar18->size = sVar55;
      }
      sVar55 = pVVar18->els_num;
      __tp = (tm *)pVVar18->varr;
      pVVar18->els_num = sVar55 + 1;
      *(undefined8 *)(&__tp->tm_sec + sVar55 * 2) = 0;
      if (pcVar57->headers == (VARR_char_ptr_t *)0x0) goto LAB_0017a3c9;
      pcVar57->header_dirs = pcVar57->headers->varr;
      if (pcVar57->system_headers != (VARR_char_ptr_t *)0x0) {
        pcVar57->system_header_dirs = pcVar57->system_headers->varr;
        pcVar49 = pcVar57->options;
        if (pcVar49->macro_commands_num != 0) {
          uVar27 = 0;
          do {
            pcVar9 = pcVar49->macro_commands[uVar27].name;
            pcVar60 = pcVar49->macro_commands[uVar27].def;
            ppStack_b0 = pcVar57->pre_ctx;
            if (pcVar60 == (char *)0x0) {
              pos_01.lno = 1;
              pos_01.ln_pos = 0;
              pos_01.fname = "<command-line>";
              ptVar28 = new_id_token(pcVar57,pos_01,pcVar9);
              iVar56 = check_id_p(pcVar57,ptVar28->repr);
              if (iVar56 != 0) {
                tStack_f8._0_8_ = ptVar28;
                HTAB_macro_t_do(ppStack_b0->macro_tab,(macro_t)&tStack_f8,HTAB_DELETE,&pmStack_c0);
              }
            }
            else {
              pptVar58 = (token_t *)&DAT_00000018;
              uStack_a8 = uVar27;
              pVVar15 = (VARR_token_t *)malloc(0x18);
              if (pVVar15 == (VARR_token_t *)0x0) goto LAB_0017a365;
              pVVar15->els_num = 0;
              pVVar15->size = 0x10;
              pptVar58 = (token_t *)malloc(0x80);
              pVVar15->varr = pptVar58;
              pos_00.lno = 1;
              pos_00.ln_pos = 0;
              pos_00.fname = "<command-line>";
              pcVar59 = pcVar57;
              ptVar28 = new_id_token(pcVar57,pos_00,pcVar9);
              pVVar8 = pcVar57->temp_string;
              if ((pVVar8 == (VARR_char *)0x0) || (pVVar8->varr == (char *)0x0)) goto LAB_0017a37e;
              pVVar8->els_num = 0;
              cVar1 = *pcVar60;
              pcVar57 = pcStack_b8;
              while (pcStack_b8 = pcVar57, cVar1 != '\0') {
                pcVar60 = pcVar60 + 1;
                pVVar8 = pcVar57->temp_string;
                pptVar58 = (token_t *)pVVar8->varr;
                if (pptVar58 == (token_t *)0x0) {
                  compile_init_cold_3();
                  goto LAB_0017a360;
                }
                uVar27 = pVVar8->els_num + 1;
                if (pVVar8->size < uVar27) {
                  sVar17 = (uVar27 >> 1) + uVar27;
                  pcVar9 = (char *)realloc(pptVar58,sVar17);
                  pVVar8->varr = pcVar9;
                  pVVar8->size = sVar17;
                }
                sVar55 = pVVar8->els_num;
                pVVar8->els_num = sVar55 + 1;
                pVVar8->varr[sVar55] = cVar1;
                pcVar57 = pcStack_b8;
                cVar1 = *pcVar60;
              }
              pVVar8 = pcVar57->temp_string;
              pcVar59 = (c2m_ctx_t)pVVar8->varr;
              if (pcVar59 == (c2m_ctx_t)0x0) goto LAB_0017a38d;
              uVar27 = pVVar8->els_num + 1;
              if (pVVar8->size < uVar27) {
                sVar17 = (uVar27 >> 1) + uVar27;
                pcVar9 = (char *)realloc(pcVar59,sVar17);
                pVVar8->varr = pcVar9;
                pVVar8->size = sVar17;
              }
              sVar55 = pVVar8->els_num;
              pVVar8->els_num = sVar55 + 1;
              pVVar8->varr[sVar55] = '\0';
              pcVar59 = (c2m_ctx_t)pcVar57->temp_string;
              reverse((VARR_char *)pcVar59);
              if (pcVar57->temp_string == (VARR_char *)0x0) goto LAB_0017a392;
              pos.lno = 1;
              pos.ln_pos = 0;
              pos.fname = "<command-line>";
              set_string_stream(pcVar57,pcVar57->temp_string->varr,pos,
                                (_func_void_char_ptr_VARR_char_ptr *)0x0);
              while( true ) {
                ptVar50 = get_next_pptoken_1(pcVar57,0);
                if ((*(short *)ptVar50 == 0x13d) || (*(short *)ptVar50 == 0x147)) break;
                pptVar58 = pVVar15->varr;
                if (pptVar58 == (token_t *)0x0) goto LAB_0017a360;
                uVar27 = pVVar15->els_num + 1;
                if (pVVar15->size < uVar27) {
                  sVar55 = (uVar27 >> 1) + uVar27;
                  pptVar58 = (token_t *)realloc(pptVar58,sVar55 * 8);
                  pVVar15->varr = pptVar58;
                  pVVar15->size = sVar55;
                }
                sVar55 = pVVar15->els_num;
                pVVar15->els_num = sVar55 + 1;
                pVVar15->varr[sVar55] = ptVar50;
              }
              iVar56 = check_id_p(pcVar57,ptVar28->repr);
              ppVar16 = ppStack_b0;
              uVar27 = uStack_a8;
              if (iVar56 != 0) {
                tStack_f8._0_8_ = ptVar28;
                iVar56 = HTAB_macro_t_do(ppStack_b0->macro_tab,(macro_t)&tStack_f8,HTAB_FIND,
                                         &pmStack_c0);
                if (iVar56 != 0) {
                  iVar56 = replacement_eq_p(pmStack_c0->replacement,pVVar15);
                  if ((iVar56 == 0) &&
                     (pFVar5 = (FILE *)pcVar57->options->message_file, pFVar5 != (FILE *)0x0)) {
                    fprintf(pFVar5,"warning -- redefinition of macro %s on the command line\n",
                            ptVar28->repr);
                  }
                  HTAB_macro_t_do(ppVar16->macro_tab,(macro_t)&tStack_f8,HTAB_DELETE,&pmStack_c0);
                }
                new_macro(pcVar57,(token_t)tStack_f8._0_8_,(VARR_token_t *)0x0,pVVar15);
                uVar27 = uStack_a8;
              }
            }
            uVar27 = uVar27 + 1;
            pcVar49 = pcVar57->options;
          } while (uVar27 < pcVar49->macro_commands_num);
        }
        pptVar58 = (token_t *)&DAT_00000018;
        pVVar38 = (VARR_node_t *)malloc(0x18);
        pcVar57->call_nodes = pVVar38;
        if (pVVar38 != (VARR_node_t *)0x0) {
          pVVar38->els_num = 0;
          pVVar38->size = 0x80;
          ppnVar39 = (node_t_conflict *)malloc(0x400);
          pVVar38->varr = ppnVar39;
          pptVar58 = (token_t *)&DAT_00000018;
          pVVar38 = (VARR_node_t *)malloc(0x18);
          pcVar57->containing_anon_members = pVVar38;
          if (pVVar38 != (VARR_node_t *)0x0) {
            pVVar38->els_num = 0;
            pVVar38->size = 8;
            ppnVar39 = (node_t_conflict *)malloc(0x40);
            pVVar38->varr = ppnVar39;
            pptVar58 = (token_t *)&DAT_00000018;
            pVVar51 = (VARR_init_object_t *)malloc(0x18);
            pcVar57->init_object_path = pVVar51;
            if (pVVar51 != (VARR_init_object_t *)0x0) {
              pVVar51->els_num = 0;
              pVVar51->size = 8;
              piVar52 = (init_object_t *)malloc(0xc0);
              pVVar51->varr = piVar52;
              return;
            }
          }
        }
        goto LAB_0017a365;
      }
      goto LAB_0017a3ce;
    }
    pptVar58 = (token_t *)&DAT_00000018;
    pVVar15 = (VARR_token_t *)malloc(0x18);
    if (pVVar15 == (VARR_token_t *)0x0) goto LAB_0017a365;
    pVVar15->els_num = 0;
    pVVar15->size = 1;
    pptVar58 = (token_t *)malloc(8);
    pVVar15->varr = pptVar58;
    __tp = (tm *)0x1ba543;
    pcVar37 = (c2m_ctx_t)0x0;
    ptVar28 = new_id_token(pcVar57,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"$");
    pptVar58 = pVVar15->varr;
    if (pptVar58 != (token_t *)0x0) {
      uVar27 = pVVar15->els_num + 1;
      if (pVVar15->size < uVar27) {
        sVar55 = (uVar27 >> 1) + uVar27;
        pptVar58 = (token_t *)realloc(pptVar58,sVar55 * 8);
        pVVar15->varr = pptVar58;
        pVVar15->size = sVar55;
      }
      sVar55 = pVVar15->els_num;
      pVVar15->els_num = sVar55 + 1;
      pVVar15->varr[sVar55] = ptVar28;
      ptVar28 = new_id_token(pcVar57,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__has_include");
      new_macro(pcVar57,ptVar28,pVVar15,(VARR_token_t *)0x0);
      pptVar58 = (token_t *)&DAT_00000018;
      pVVar15 = (VARR_token_t *)malloc(0x18);
      if (pVVar15 == (VARR_token_t *)0x0) goto LAB_0017a365;
      pVVar15->els_num = 0;
      pVVar15->size = 1;
      pptVar58 = (token_t *)malloc(8);
      pVVar15->varr = pptVar58;
      __tp = (tm *)0x1ba543;
      pcVar37 = (c2m_ctx_t)0x0;
      ptVar28 = new_id_token(pcVar57,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"$");
      pptVar58 = pVVar15->varr;
      if (pptVar58 == (token_t *)0x0) goto LAB_0017a3d8;
      uVar27 = pVVar15->els_num + 1;
      if (pVVar15->size < uVar27) {
        sVar55 = (uVar27 >> 1) + uVar27;
        pptVar58 = (token_t *)realloc(pptVar58,sVar55 * 8);
        pVVar15->varr = pptVar58;
        pVVar15->size = sVar55;
      }
      sVar55 = pVVar15->els_num;
      pVVar15->els_num = sVar55 + 1;
      pVVar15->varr[sVar55] = ptVar28;
      ptVar28 = new_id_token(pcVar57,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__has_builtin");
      new_macro(pcVar57,ptVar28,pVVar15,(VARR_token_t *)0x0);
      goto LAB_00179040;
    }
  }
  compile_init_cold_22();
LAB_0017a3d8:
  compile_init_cold_21();
  if (fname == (char *)0x0) {
    __assert_fail("fname != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x3ad,"void add_stream(c2m_ctx_t, FILE *, const char *, int (*)(c2m_ctx_t))");
  }
  ptVar28 = pptVar58[0x22];
  if (((ptVar28 != (token_t)0x0) && (pFVar5 = *(FILE **)ptVar28, pFVar5 != (FILE *)0x0)) &&
     (pFVar5 != _stdin)) {
    fgetpos(pFVar5,(fpos_t *)(ptVar28 + 1));
    fclose(*(FILE **)pptVar58[0x22]);
    *(undefined8 *)pptVar58[0x22] = 0;
  }
  psVar53 = new_stream((FILE *)pcVar37,fname,(_func_int_c2m_ctx_t *)__tp);
  pptVar58[0x22] = (token_t)psVar53;
  ptVar28 = pptVar58[0x21];
  pvVar54 = *(void **)&(ptVar28->pos).lno;
  if (pvVar54 == (void *)0x0) {
    add_stream_cold_1();
    (**(code **)((long)pvVar54 + 0x148))(*(undefined8 *)((long)pvVar54 + 0x150));
    return;
  }
  pcVar9 = (char *)(*(long *)ptVar28 + 1);
  if ((ptVar28->pos).fname < pcVar9) {
    pvVar54 = realloc(pvVar54,(long)(pcVar9 + ((ulong)pcVar9 >> 1)) * 8);
    *(void **)&(ptVar28->pos).lno = pvVar54;
    (ptVar28->pos).fname = pcVar9 + ((ulong)pcVar9 >> 1);
  }
  lVar6 = *(long *)ptVar28;
  lVar7 = *(long *)&(ptVar28->pos).lno;
  *(long *)ptVar28 = lVar6 + 1;
  *(stream_t *)(lVar7 + lVar6 * 8) = psVar53;
  return;
}

Assistant:

static void compile_finish (c2m_ctx_t c2m_ctx) {
  if (symbol_text != NULL) VARR_DESTROY (char, symbol_text);
  if (temp_string != NULL) VARR_DESTROY (char, temp_string);
  if (node_positions != NULL) VARR_DESTROY (pos_t, node_positions);
  parse_finish (c2m_ctx);
  context_finish (c2m_ctx);
  if (headers != NULL) VARR_DESTROY (char_ptr_t, headers);
  if (system_headers != NULL) VARR_DESTROY (char_ptr_t, system_headers);
  if (call_nodes != NULL) VARR_DESTROY (node_t, call_nodes);
  if (containing_anon_members != NULL) VARR_DESTROY (node_t, containing_anon_members);
  if (init_object_path != NULL) VARR_DESTROY (init_object_t, init_object_path);
}